

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O1

int __thiscall
deqp::egl::anon_unknown_0::ThreadCleanUpTest::init(ThreadCleanUpTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  deUint32 dVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  Library *egl;
  EGLDisplay pvVar3;
  FilterList *this_00;
  EGLConfig pvVar4;
  EGLConfig extraout_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FilterList filters;
  FilterList local_38;
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar3 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_display = pvVar3;
  local_38.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = eglu::FilterList::operator<<(&local_38,isES2Renderable);
  eglu::FilterList::operator<<(this_00,isPBuffer);
  pvVar4 = eglu::chooseSingleConfig(egl,this->m_display,&local_38);
  this->m_config = pvVar4;
  if (local_38.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    pvVar4 = extraout_RAX;
  }
  iVar1 = (int)pvVar4;
  if (this->m_contextType == CONTEXTTYPE_SINGLE) {
    local_38.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200003098;
    local_38.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_38.m_rules.
                           super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3038);
    (**egl->_vptr_Library)(egl,0x30a0);
    iVar1 = (*egl->_vptr_Library[6])(egl,this->m_display,this->m_config,0,&local_38);
    this->m_context = (EGLContext)CONCAT44(extraout_var,iVar1);
    dVar2 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar2,"Failed to create context",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglThreadCleanUpTests.cpp"
                     ,0xd0);
    iVar1 = extraout_EAX;
  }
  if (this->m_surfaceType == SURFACETYPE_SINGLE) {
    local_38.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2000003057;
    local_38.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2000003056;
    local_38.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_38.m_rules.
                           super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x3038);
    iVar1 = (*egl->_vptr_Library[10])(egl,this->m_display,this->m_config);
    this->m_surface = (EGLSurface)CONCAT44(extraout_var_00,iVar1);
    dVar2 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar2,"Failed to create surface",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglThreadCleanUpTests.cpp"
                     ,0xdd);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void init (void)
	{
		const Library&	egl	= m_eglTestCtx.getLibrary();

		m_display = eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

		{
			eglu::FilterList filters;
			filters << isES2Renderable << isPBuffer;
			m_config = eglu::chooseSingleConfig(egl, m_display, filters);
		}

		if (m_contextType == CONTEXTTYPE_SINGLE)
		{
			const EGLint	attribList[] =
			{
				EGL_CONTEXT_CLIENT_VERSION, 2,
				EGL_NONE
			};

			egl.bindAPI(EGL_OPENGL_ES_API);

			m_context = egl.createContext(m_display, m_config, EGL_NO_CONTEXT, attribList);
			EGLU_CHECK_MSG(egl, "Failed to create context");
		}

		if (m_surfaceType == SURFACETYPE_SINGLE)
		{
			const EGLint attribs[] =
			{
				EGL_WIDTH, 32,
				EGL_HEIGHT, 32,
				EGL_NONE
			};

			m_surface = egl.createPbufferSurface(m_display, m_config, attribs);
			EGLU_CHECK_MSG(egl, "Failed to create surface");
		}
	}